

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O2

size_t testing::internal::GetThreadCount(void)

{
  __pid_t _Var1;
  ostream *this;
  size_t sVar2;
  int iVar3;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_270;
  ifstream file;
  size_type *local_68;
  string dummy;
  string filename;
  
  Message::Message((Message *)&local_270);
  this = (ostream *)(local_270.ptr_ + 0x10);
  std::operator<<(this,"/proc/");
  _Var1 = getpid();
  std::ostream::operator<<(this,_Var1);
  std::operator<<((ostream *)(local_270.ptr_ + 0x10),"/stat");
  StringStreamToString((string *)((long)&dummy.field_2 + 8),local_270.ptr_);
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_270);
  local_68 = &dummy._M_string_length;
  dummy._M_dataplus._M_p = (pointer)0x0;
  dummy._M_string_length._0_1_ = 0;
  std::ifstream::ifstream(&local_270,(char *)dummy.field_2._8_8_,_S_in);
  iVar3 = -0x14;
  while (iVar3 = iVar3 + 1, iVar3 != 0) {
    std::operator>>((istream *)&local_270,(string *)&local_68);
  }
  filename.field_2._12_4_ = 0;
  std::istream::operator>>((istream *)&local_270,(int *)(filename.field_2._M_local_buf + 0xc));
  sVar2 = (size_t)(int)filename.field_2._12_4_;
  std::ifstream::~ifstream(&local_270);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)(dummy.field_2._M_local_buf + 8));
  return sVar2;
}

Assistant:

size_t GetThreadCount() {
  const std::string filename =
      (Message() << "/proc/" << getpid() << "/stat").GetString();
  return ReadProcFileField<int>(filename, 19);
}